

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O1

void vkt::Draw::MemoryOp::pack
               (int pixelSize,int width,int height,int depth,VkDeviceSize rowPitchOrZero,
               VkDeviceSize depthPitchOrZero,void *srcBuffer,void *destBuffer)

{
  void *__dest;
  int iVar1;
  void *__src;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = (size_t)(pixelSize * width);
  if (rowPitchOrZero == 0) {
    rowPitchOrZero = sVar2;
  }
  if (depthPitchOrZero == 0) {
    depthPitchOrZero = (long)height * rowPitchOrZero;
  }
  if ((long)height * rowPitchOrZero == depthPitchOrZero && rowPitchOrZero == sVar2) {
    memcpy(destBuffer,srcBuffer,depthPitchOrZero * (long)depth);
    return;
  }
  if (0 < depth) {
    uVar3 = 0;
    do {
      if (0 < height) {
        __dest = (void *)(depthPitchOrZero * uVar3 + (long)destBuffer);
        __src = (void *)((long)(pixelSize * width * height * (int)uVar3) + (long)srcBuffer);
        iVar1 = height;
        do {
          memcpy(__dest,__src,rowPitchOrZero);
          __src = (void *)((long)__src + sVar2);
          __dest = (void *)((long)__dest + rowPitchOrZero);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)depth);
  }
  return;
}

Assistant:

void MemoryOp::pack (int				pixelSize,
					 int				width,
					 int				height,
					 int				depth,
					 vk::VkDeviceSize	rowPitchOrZero,
					 vk::VkDeviceSize	depthPitchOrZero,
					 const void *		srcBuffer,
					 void *				destBuffer)
{
	vk::VkDeviceSize rowPitch	= rowPitchOrZero;
	vk::VkDeviceSize depthPitch	= depthPitchOrZero;

	if (rowPitch == 0)
		rowPitch = width * pixelSize;

	if (depthPitch == 0)
		depthPitch = rowPitch * height;

	const vk::VkDeviceSize size = depthPitch * depth;

	const deUint8 *srcRow = reinterpret_cast<const deUint8 *>(srcBuffer);
	const deUint8 *srcStart;
	srcStart = srcRow;
	deUint8 *dstRow = reinterpret_cast<deUint8 *>(destBuffer);
	deUint8 *dstStart;
	dstStart = dstRow;

	if (rowPitch == static_cast<vk::VkDeviceSize>(width * pixelSize) &&
		depthPitch == static_cast<vk::VkDeviceSize>(rowPitch * height))
	{
		// fast path
		deMemcpy(dstRow, srcRow, static_cast<size_t>(size));
	}
	else
	{
		// slower, per row path
		for (int d = 0; d < depth; d++)
		{
			vk::VkDeviceSize offsetDepthDst = d * depthPitch;
			vk::VkDeviceSize offsetDepthSrc = d * (pixelSize * width * height);
			srcRow = srcStart + offsetDepthSrc;
			dstRow = dstStart + offsetDepthDst;
			for (int r = 0; r < height; ++r)
			{
				deMemcpy(dstRow, srcRow, static_cast<size_t>(rowPitch));
				srcRow += pixelSize * width;
				dstRow += rowPitch;
			}
		}
	}
}